

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O2

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::tryToOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this,
          Expression *oneSide,Expression *otherSide)

{
  Store *pSVar1;
  Result RVar2;
  Literal local_40;
  
  if (oneSide->_id == ConstId) {
    Literal::Literal(&local_40,(Literal *)(oneSide + 1));
    RVar2 = canOptimizeConstant(this,&local_40);
    Literal::~Literal(&local_40);
    if (((undefined1  [16])RVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pSVar1 = this->curr;
      (pSVar1->offset).addr = RVar2.total.addr.addr;
      pSVar1->ptr = otherSide;
      if (otherSide->_id != ConstId) {
        return true;
      }
      optimizeConstantPointer(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool tryToOptimizeConstant(Expression* oneSide, Expression* otherSide) {
    if (auto* c = oneSide->dynCast<Const>()) {
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        curr->offset = result.total;
        curr->ptr = otherSide;
        if (curr->ptr->template is<Const>()) {
          optimizeConstantPointer();
        }
        return true;
      }
    }
    return false;
  }